

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fRasterizerDiscardTests.cpp
# Opt level: O3

IterateResult __thiscall
deqp::gles3::Functional::RasterizerDiscardCase::iterate(RasterizerDiscardCase *this)

{
  Random *rnd;
  ostringstream *poVar1;
  TextureFormat this_00;
  RenderContext *context;
  bool bVar2;
  byte bVar3;
  byte bVar4;
  GLenum GVar5;
  RenderTarget *pRVar6;
  long *plVar7;
  undefined8 *puVar8;
  RenderTarget *pRVar9;
  TestLog *pTVar10;
  int iVar11;
  size_type *psVar12;
  ulong *puVar13;
  Surface *surface;
  undefined1 *value;
  void *__buf;
  IterateResult IVar14;
  GLsizei count;
  long lVar15;
  char *pcVar16;
  GLbitfield mask;
  int iVar17;
  undefined8 uVar18;
  ulong uVar19;
  int iVar20;
  deUint32 mode;
  uint uVar21;
  float fVar22;
  vector<float,_std::allocator<float>_> vertices;
  Surface pixels;
  string header;
  string local_270;
  GLint local_24c;
  vector<float,_std::allocator<float>_> local_248;
  string local_230;
  Surface local_210;
  string local_1f0;
  ulong *local_1d0;
  long local_1c8;
  ulong local_1c0 [2];
  undefined1 local_1b0 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1a0;
  _Alloc_hider local_190;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_180 [4];
  ios_base local_140 [8];
  ios_base local_138 [264];
  
  this_00 = (TextureFormat)((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  pRVar6 = Context::getRenderTarget((this->super_TestCase).m_context);
  local_24c = glwGetUniformLocation((this->m_program->m_program).m_program,"u_color");
  local_248.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_248.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_248.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  iVar11 = this->m_iterNdx;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1b0);
  std::ostream::operator<<(local_1b0,iVar11 + 1);
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1b0);
  std::ios_base::~ios_base(local_140);
  plVar7 = (long *)std::__cxx11::string::replace((ulong)&local_210,0,(char *)0x0,0x1bef478);
  local_230._M_dataplus._M_p = (pointer)&local_230.field_2;
  psVar12 = (size_type *)(plVar7 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar7 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar12) {
    local_230.field_2._M_allocated_capacity = *psVar12;
    local_230.field_2._8_8_ = plVar7[3];
  }
  else {
    local_230.field_2._M_allocated_capacity = *psVar12;
    local_230._M_dataplus._M_p = (pointer)*plVar7;
  }
  local_230._M_string_length = plVar7[1];
  *plVar7 = (long)psVar12;
  plVar7[1] = 0;
  *(undefined1 *)(plVar7 + 2) = 0;
  plVar7 = (long *)std::__cxx11::string::append((char *)&local_230);
  local_270._M_dataplus._M_p = (pointer)&local_270.field_2;
  puVar13 = (ulong *)(plVar7 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar7 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)puVar13) {
    local_270.field_2._M_allocated_capacity = *puVar13;
    local_270.field_2._8_8_ = plVar7[3];
  }
  else {
    local_270.field_2._M_allocated_capacity = *puVar13;
    local_270._M_dataplus._M_p = (pointer)*plVar7;
  }
  local_270._M_string_length = plVar7[1];
  *plVar7 = (long)puVar13;
  plVar7[1] = 0;
  *(undefined1 *)(plVar7 + 2) = 0;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1b0);
  std::ostream::operator<<(local_1b0,1);
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1b0);
  std::ios_base::~ios_base(local_140);
  uVar18 = 0xf;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_270._M_dataplus._M_p != &local_270.field_2) {
    uVar18 = local_270.field_2._M_allocated_capacity;
  }
  if ((ulong)uVar18 < local_1c8 + local_270._M_string_length) {
    uVar19 = 0xf;
    if (local_1d0 != local_1c0) {
      uVar19 = local_1c0[0];
    }
    if (uVar19 < local_1c8 + local_270._M_string_length) goto LAB_011938de;
    puVar8 = (undefined8 *)
             std::__cxx11::string::replace
                       ((ulong)&local_1d0,0,(char *)0x0,(ulong)local_270._M_dataplus._M_p);
  }
  else {
LAB_011938de:
    puVar8 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_270,(ulong)local_1d0);
  }
  local_1f0._M_dataplus._M_p = (pointer)&local_1f0.field_2;
  psVar12 = puVar8 + 2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*puVar8 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar12) {
    local_1f0.field_2._M_allocated_capacity = *psVar12;
    local_1f0.field_2._8_8_ = puVar8[3];
  }
  else {
    local_1f0.field_2._M_allocated_capacity = *psVar12;
    local_1f0._M_dataplus._M_p = (pointer)*puVar8;
  }
  local_1f0._M_string_length = puVar8[1];
  *puVar8 = psVar12;
  puVar8[1] = 0;
  *(undefined1 *)psVar12 = 0;
  if (local_1d0 != local_1c0) {
    operator_delete(local_1d0,local_1c0[0] + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_270._M_dataplus._M_p != &local_270.field_2) {
    operator_delete(local_270._M_dataplus._M_p,local_270.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_230._M_dataplus._M_p != &local_230.field_2) {
    operator_delete(local_230._M_dataplus._M_p,local_230.field_2._M_allocated_capacity + 1);
  }
  if ((size_t *)CONCAT44(local_210.m_height,local_210.m_width) != &local_210.m_pixels.m_cap) {
    operator_delete((undefined1 *)CONCAT44(local_210.m_height,local_210.m_width),
                    local_210.m_pixels.m_cap + 1);
  }
  tcu::LogSection::LogSection((LogSection *)local_1b0,&local_1f0,&local_1f0);
  tcu::TestLog::startSection((TestLog *)this_00,(char *)local_1b0._0_8_,local_190._M_p);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_190._M_p != local_180) {
    operator_delete(local_190._M_p,local_180[0]._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1b0._0_8_ != &local_1a0) {
    operator_delete((void *)local_1b0._0_8_,local_1a0._M_allocated_capacity + 1);
  }
  uVar21 = this->m_caseOptions;
  if ((uVar21 & 1) != 0) {
    setupFramebufferObject(this);
    uVar21 = this->m_caseOptions;
  }
  if ((uVar21 & 2) != 0) {
    glwEnable(0xc11);
    glwScissor(0,0,pRVar6->m_width,pRVar6->m_height);
    poVar1 = (ostringstream *)(local_1b0 + 8);
    local_1b0._0_8_ = this_00;
    std::__cxx11::ostringstream::ostringstream(poVar1);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar1,"Scissor test enabled: glScissor(0, 0, ",0x26);
    std::ostream::operator<<(poVar1,pRVar6->m_width);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,", ",2);
    std::ostream::operator<<(poVar1,pRVar6->m_height);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,")",1);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(poVar1);
    std::ios_base::~ios_base(local_138);
  }
  glwUseProgram((this->m_program->m_program).m_program);
  glwEnable(0xb71);
  glwDepthRangef(0.0,1.0);
  glwDepthFunc(0x203);
  glwEnable(0xb90);
  glwStencilFunc(0x205,1,0xff);
  glwStencilOp(0x1e01,0x1e00,0x1e00);
  glwClearColor(0.0,0.0,0.5,1.0);
  glwClearDepthf(1.0);
  glwClearStencil(0);
  glwClear(0x4500);
  glwEnableVertexAttribArray(0);
  if (this->m_drawMode < 7) {
    uVar21 = this->m_numPrimitives;
    switch(this->m_drawMode) {
    case 0:
      break;
    case 1:
      uVar21 = uVar21 * 2;
      break;
    default:
      uVar21 = uVar21 + 2;
      break;
    case 3:
      uVar21 = uVar21 + 1;
      break;
    case 4:
      uVar21 = uVar21 * 3;
    }
  }
  else {
    uVar21 = 0;
  }
  std::vector<float,_std::allocator<float>_>::resize(&local_248,(long)(int)(uVar21 * 4));
  if (0 < (int)uVar21) {
    rnd = &this->m_rnd;
    lVar15 = 0;
    do {
      fVar22 = deRandom_getFloat(&rnd->m_rnd);
      iVar11 = (int)lVar15;
      local_248.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_start[iVar11] = fVar22 + fVar22 + -1.0;
      fVar22 = deRandom_getFloat(&rnd->m_rnd);
      local_248.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_start[iVar11 + 1] = fVar22 + fVar22 + -1.0;
      fVar22 = deRandom_getFloat(&rnd->m_rnd);
      local_248.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_start[iVar11 + 2] = fVar22 * 0.79999995 + 0.1;
      local_248.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_start[iVar11 + 3] = 1.0;
      lVar15 = lVar15 + 4;
    } while ((ulong)uVar21 << 2 != lVar15);
  }
  glwVertexAttribPointer
            (0,4,0x1406,'\0',0,
             local_248.super__Vector_base<float,_std::allocator<float>_>._M_impl.
             super__Vector_impl_data._M_start);
  if (this->m_caseType - CASE_CLEAR_DEPTH < 2) {
    glwClearColor(0.0,0.0,0.0,1.0);
    glwClear(0x4000);
  }
  glwUniform4f(local_24c,1.0,0.0,0.0,1.0);
  glwClearColor(1.0,0.0,0.0,1.0);
  glwClearDepthf(0.0);
  glwClearStencil(1);
  glwEnable(0x8c89);
  GVar5 = glwGetError();
  glu::checkError(GVar5,"Rasterizer discard enabled",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/functional/es3fRasterizerDiscardTests.cpp"
                  ,0x148);
  switch(this->m_caseType) {
  case CASE_WRITE_DEPTH:
  case CASE_WRITE_STENCIL:
    iVar11 = (int)((ulong)((long)local_248.super__Vector_base<float,_std::allocator<float>_>._M_impl
                                 .super__Vector_impl_data._M_finish -
                          (long)local_248.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                                super__Vector_impl_data._M_start) >> 2);
    iVar17 = iVar11 + 3;
    if (-1 < iVar11) {
      iVar17 = iVar11;
    }
    glwDrawArrays(this->m_drawMode,0,iVar17 >> 2);
    break;
  case CASE_CLEAR_COLOR:
    mask = 0x4000;
    if ((this->m_caseOptions & 1) == 0) goto LAB_01193de1;
    value = FAIL_COLOR_RED;
    GVar5 = 0x1800;
LAB_01193df4:
    glwClearBufferfv(GVar5,0,(GLfloat *)value);
    break;
  case CASE_CLEAR_DEPTH:
    mask = 0x100;
    if ((this->m_caseOptions & 1) != 0) {
      value = (undefined1 *)&FAIL_DEPTH;
      GVar5 = 0x1801;
      goto LAB_01193df4;
    }
LAB_01193de1:
    glwClear(mask);
    break;
  case CASE_CLEAR_STENCIL:
    mask = 0x400;
    if ((this->m_caseOptions & 1) == 0) goto LAB_01193de1;
    glwClearBufferiv(0x1802,0,&FAIL_STENCIL);
  }
  glwDisable(0x8c89);
  GVar5 = glwGetError();
  glu::checkError(GVar5,"Rasterizer discard disabled",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/functional/es3fRasterizerDiscardTests.cpp"
                  ,0x159);
  if (this->m_caseType - CASE_CLEAR_DEPTH < 2) {
    glwUniform4f(local_24c,0.0,0.0,0.5,1.0);
    mode = this->m_drawMode;
    iVar11 = (int)((ulong)((long)local_248.super__Vector_base<float,_std::allocator<float>_>._M_impl
                                 .super__Vector_impl_data._M_finish -
                          (long)local_248.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                                super__Vector_impl_data._M_start) >> 2);
    iVar17 = iVar11 + 3;
    if (-1 < iVar11) {
      iVar17 = iVar11;
    }
    count = iVar17 >> 2;
  }
  else {
    if ((this->m_caseType != CASE_WRITE_STENCIL) ||
       (((this->m_caseOptions & 1) == 0 &&
        (pRVar9 = Context::getRenderTarget((this->super_TestCase).m_context),
        pRVar9->m_stencilBits < 1)))) goto LAB_01193ed5;
    count = 4;
    glwVertexAttribPointer(0,4,0x1406,'\0',0,UNIT_SQUARE);
    mode = 5;
    glwStencilFunc(0x202,1,0xff);
  }
  glwDrawArrays(mode,0,count);
LAB_01193ed5:
  glwFinish();
  glwDisable(0xb90);
  glwDisable(0xb71);
  glwDisable(0xc11);
  tcu::Surface::Surface(&local_210,pRVar6->m_width,pRVar6->m_height);
  context = ((this->super_TestCase).m_context)->m_renderCtx;
  local_270._M_dataplus._M_p = (pointer)0x300000008;
  if ((void *)local_210.m_pixels.m_cap != (void *)0x0) {
    local_210.m_pixels.m_cap = (size_t)local_210.m_pixels.m_ptr;
  }
  tcu::PixelBufferAccess::PixelBufferAccess
            ((PixelBufferAccess *)local_1b0,(TextureFormat *)&local_270,local_210.m_width,
             local_210.m_height,1,(void *)local_210.m_pixels.m_cap);
  glu::readPixels(context,0,0,(PixelBufferAccess *)local_1b0);
  bVar3 = 1;
  iVar11 = 0;
  if (local_210.m_height < 1) {
    bVar4 = 0;
  }
  else {
    iVar17 = 0;
    bVar4 = 0;
    do {
      uVar19 = (ulong)(uint)local_210.m_width;
      iVar20 = iVar11;
      if (0 < local_210.m_width) {
        do {
          uVar21 = *(uint *)((long)local_210.m_pixels.m_ptr + (long)iVar20 * 4);
          bVar4 = (uVar21 & 0xff0000) != 0 | bVar4;
          if ((char)uVar21 != '\0') {
            bVar3 = 0;
            goto LAB_01193fbd;
          }
          iVar20 = iVar20 + 1;
          uVar19 = uVar19 - 1;
        } while (uVar19 != 0);
      }
      iVar17 = iVar17 + 1;
      iVar11 = iVar11 + local_210.m_width;
    } while (iVar17 != local_210.m_height);
  }
LAB_01193fbd:
  if ((this->m_caseOptions & 1) != 0) {
    deleteFramebufferObject(this);
  }
  bVar2 = (bool)(bVar4 & bVar3);
  if (!bVar2) {
    local_270._M_dataplus._M_p = (pointer)&local_270.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_270,"Result image","");
    local_230._M_dataplus._M_p = (pointer)&local_230.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_230,"Result image","");
    surface = &local_210;
    tcu::LogImage::LogImage
              ((LogImage *)local_1b0,&local_270,&local_230,surface,QP_IMAGE_COMPRESSION_MODE_BEST);
    tcu::LogImage::write((LogImage *)local_1b0,this_00.order,__buf,(size_t)surface);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_190._M_p != local_180) {
      operator_delete(local_190._M_p,local_180[0]._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1b0._0_8_ != &local_1a0) {
      operator_delete((void *)local_1b0._0_8_,local_1a0._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_230._M_dataplus._M_p != &local_230.field_2) {
      operator_delete(local_230._M_dataplus._M_p,local_230.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_270._M_dataplus._M_p != &local_270.field_2) {
      operator_delete(local_270._M_dataplus._M_p,local_270.field_2._M_allocated_capacity + 1);
    }
  }
  poVar1 = (ostringstream *)(local_1b0 + 8);
  local_1b0._0_8_ = this_00;
  std::__cxx11::ostringstream::ostringstream(poVar1);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"Test result: ",0xd);
  pcVar16 = "Failed!";
  if (bVar2) {
    pcVar16 = "Passed!";
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,pcVar16,7);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(poVar1);
  std::ios_base::~ios_base(local_138);
  poVar1 = (ostringstream *)(local_1b0 + 8);
  if (bVar2) {
    local_1b0._0_8_ = this_00;
    std::__cxx11::ostringstream::ostringstream(poVar1);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar1,"Primitive or buffer clear was discarded correctly.",0x32);
    pTVar10 = tcu::MessageBuilder::operator<<
                        ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::TestLog::endSection(pTVar10);
    std::__cxx11::ostringstream::~ostringstream(poVar1);
    std::ios_base::~ios_base(local_138);
    uVar21 = this->m_iterNdx;
    this->m_iterNdx = uVar21 + 1;
    IVar14 = (IterateResult)(0x7ffffffe < uVar21);
  }
  else {
    local_1b0._0_8_ = this_00;
    std::__cxx11::ostringstream::ostringstream(poVar1);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar1,"Primitive or buffer clear was not discarded.",0x2c);
    pTVar10 = tcu::MessageBuilder::operator<<
                        ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::TestLog::endSection(pTVar10);
    std::__cxx11::ostringstream::~ostringstream(poVar1);
    std::ios_base::~ios_base(local_138);
    IVar14 = STOP;
    tcu::TestContext::setTestResult
              ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,QP_TEST_RESULT_FAIL,
               "Fail");
  }
  tcu::Surface::~Surface(&local_210);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1f0._M_dataplus._M_p != &local_1f0.field_2) {
    operator_delete(local_1f0._M_dataplus._M_p,local_1f0.field_2._M_allocated_capacity + 1);
  }
  if (local_248.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_248.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_248.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_248.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return IVar14;
}

Assistant:

RasterizerDiscardCase::IterateResult RasterizerDiscardCase::iterate (void)
{
	TestLog&					log				= m_testCtx.getLog();
	const tcu::RenderTarget&	renderTarget	= m_context.getRenderTarget();
	deUint32					colorUnif		= glGetUniformLocation(m_program->getProgram(), "u_color");
	bool						failColorFound	= false;
	bool						passColorFound	= false;
	std::vector<float>			vertices;

	std::string header = "Case iteration " + de::toString(m_iterNdx+1) + " / " + de::toString(NUM_CASE_ITERATIONS);
	log << TestLog::Section(header, header);

	DE_ASSERT (m_program);

	// Create and bind FBO if needed

	if (m_caseOptions & CASEOPTION_FBO)
	{
		try
		{
			setupFramebufferObject();
		}
		catch (tcu::NotSupportedError& e)
		{
			log << TestLog::Message << "ERROR: " << e.what() << "." << TestLog::EndMessage << TestLog::EndSection;
			m_testCtx.setTestResult(QP_TEST_RESULT_NOT_SUPPORTED, "Not supported");
			return STOP;
		}
		catch (tcu::InternalError& e)
		{
			log << TestLog::Message << "ERROR: " << e.what() << "." << TestLog::EndMessage << TestLog::EndSection;
			m_testCtx.setTestResult(QP_TEST_RESULT_INTERNAL_ERROR, "Error");
			return STOP;
		}
	}

	if (m_caseOptions & CASEOPTION_SCISSOR)
	{
		glEnable (GL_SCISSOR_TEST);
		glScissor(0, 0, renderTarget.getWidth(), renderTarget.getHeight());
		log << TestLog::Message << "Scissor test enabled: glScissor(0, 0, " << renderTarget.getWidth() << ", " << renderTarget.getHeight() << ")" << TestLog::EndMessage;
	}

	glUseProgram	(m_program->getProgram());

	glEnable		(GL_DEPTH_TEST);
	glDepthRangef	(0.0f, 1.0f);
	glDepthFunc		(GL_LEQUAL);

	glEnable		(GL_STENCIL_TEST);
	glStencilFunc	(GL_NOTEQUAL, 1, 0xFF);
	glStencilOp		(GL_REPLACE, GL_KEEP, GL_KEEP);

	glClearColor	(PASS_COLOR_BLUE.x(), PASS_COLOR_BLUE.y(), PASS_COLOR_BLUE.z(), PASS_COLOR_BLUE.w());
	glClearDepthf	(1.0f);
	glClearStencil	(0);
	glClear			(GL_COLOR_BUFFER_BIT | GL_DEPTH_BUFFER_BIT | GL_STENCIL_BUFFER_BIT);

	// Generate vertices

	glEnableVertexAttribArray (0);
	generateVertices		  (vertices, m_numPrimitives, m_rnd, m_drawMode);
	glVertexAttribPointer	  (0, 4, GL_FLOAT, GL_FALSE, 0, &vertices[0]);

	// Clear color to black for depth and stencil clear cases

	if (m_caseType == CASE_CLEAR_DEPTH || m_caseType == CASE_CLEAR_STENCIL)
	{
		glClearColor	(BLACK_COLOR.x(), BLACK_COLOR.y(), BLACK_COLOR.z(), BLACK_COLOR.w());
		glClear			(GL_COLOR_BUFFER_BIT);
	}

	// Set fail values for color, depth and stencil

	glUniform4f		(colorUnif, FAIL_COLOR_RED.x(), FAIL_COLOR_RED.y(), FAIL_COLOR_RED.z(), FAIL_COLOR_RED.w());
	glClearColor	(FAIL_COLOR_RED.x(), FAIL_COLOR_RED.y(), FAIL_COLOR_RED.z(), FAIL_COLOR_RED.w());
	glClearDepthf	(FAIL_DEPTH);
	glClearStencil	(FAIL_STENCIL);

	// Enable rasterizer discard

	glEnable		(GL_RASTERIZER_DISCARD);
	GLU_CHECK_MSG	("Rasterizer discard enabled");

	// Do to-be-discarded primitive draws and buffer clears

	switch (m_caseType)
	{
		case CASE_WRITE_DEPTH:			glDrawArrays(m_drawMode, 0, (int)vertices.size() / 4);																	break;
		case CASE_WRITE_STENCIL:		glDrawArrays(m_drawMode, 0, (int)vertices.size() / 4);																	break;
		case CASE_CLEAR_COLOR:			(m_caseOptions & CASEOPTION_FBO) ? glClearBufferfv(GL_COLOR, 0, &FAIL_COLOR_RED[0])	: glClear(GL_COLOR_BUFFER_BIT);		break;
		case CASE_CLEAR_DEPTH:			(m_caseOptions & CASEOPTION_FBO) ? glClearBufferfv(GL_DEPTH, 0, &FAIL_DEPTH)		: glClear(GL_DEPTH_BUFFER_BIT);		break;
		case CASE_CLEAR_STENCIL:		(m_caseOptions & CASEOPTION_FBO) ? glClearBufferiv(GL_STENCIL, 0, &FAIL_STENCIL)	: glClear(GL_STENCIL_BUFFER_BIT);	break;
		default:						DE_ASSERT(false);
	}

	// Disable rasterizer discard

	glDisable		(GL_RASTERIZER_DISCARD);
	GLU_CHECK_MSG	("Rasterizer discard disabled");

	if (m_caseType == CASE_WRITE_STENCIL)
	{
		if ((m_caseOptions & CASEOPTION_FBO) || m_context.getRenderTarget().getStencilBits() > 0)
		{
			// Draw a full-screen square that colors all pixels red if they have stencil value 1.

			glVertexAttribPointer (0, 4, GL_FLOAT, GL_FALSE, 0, &UNIT_SQUARE[0]);
			glStencilFunc		  (GL_EQUAL, 1, 0xFF);
			glDrawArrays		  (GL_TRIANGLE_STRIP, 0, 4);
		}
		// \note If no stencil buffers are present and test is rendering to default framebuffer, test will always pass.
	}
	else if (m_caseType == CASE_CLEAR_DEPTH || m_caseType == CASE_CLEAR_STENCIL)
	{
		// Draw pass-indicating primitives for depth and stencil clear cases

		glUniform4f	 (colorUnif, PASS_COLOR_BLUE.x(), PASS_COLOR_BLUE.y(), PASS_COLOR_BLUE.z(), PASS_COLOR_BLUE.w());
		glDrawArrays (m_drawMode, 0, (int)vertices.size() / 4);
	}

	glFinish  ();
	glDisable (GL_STENCIL_TEST);
	glDisable (GL_DEPTH_TEST);
	glDisable (GL_SCISSOR_TEST);

	// Read and check pixel data

	tcu::Surface pixels(renderTarget.getWidth(), renderTarget.getHeight());
	glu::readPixels(m_context.getRenderContext(), 0, 0, pixels.getAccess());

	{
		int width = pixels.getWidth();
		int height = pixels.getHeight();

		for (int y = 0; y < height; y++)
		{
			for (int x = 0; x < width; x++)
			{
				if (pixels.getPixel(x,y).getBlue() != 0)
					passColorFound = true;

				if (pixels.getPixel(x,y).getRed() != 0)
				{
					failColorFound = true;
					break;
				}
			}
			if (failColorFound) break;
		}
	}

	// Delete FBO if created

	if (m_caseOptions & CASEOPTION_FBO)
		deleteFramebufferObject();

	// Evaluate test result

	bool testOk = passColorFound && !failColorFound;

	if (!testOk)
		log << TestLog::Image ("Result image", "Result image", pixels);
	log << TestLog::Message << "Test result: " << (testOk ? "Passed!" : "Failed!") << TestLog::EndMessage;

	if (!testOk)
	{
		log << TestLog::Message << "Primitive or buffer clear was not discarded." << TestLog::EndMessage << TestLog::EndSection;
		m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Fail");
		return STOP;
	}

	log << TestLog::Message << "Primitive or buffer clear was discarded correctly." << TestLog::EndMessage << TestLog::EndSection;

	return (++m_iterNdx < NUM_CASE_ITERATIONS) ? CONTINUE : STOP;
}